

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.cc
# Opt level: O0

void brotli::BuildBlockSplit
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *block_ids,BlockSplit *split)

{
  ulong uVar1;
  byte *pbVar2;
  size_type sVar3;
  byte local_29;
  ulong uStack_28;
  uint8_t next_id;
  size_t i;
  uint32_t cur_length;
  uint8_t max_type;
  uint8_t cur_id;
  BlockSplit *split_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *block_ids_local;
  
  _cur_length = split;
  split_local = (BlockSplit *)block_ids;
  pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](block_ids,0);
  i._6_1_ = *pbVar2;
  i._0_4_ = 1;
  uStack_28 = 1;
  i._7_1_ = i._6_1_;
  while( true ) {
    uVar1 = uStack_28;
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)split_local);
    if (sVar3 <= uVar1) break;
    pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)split_local,
                        uStack_28);
    local_29 = *pbVar2;
    if (local_29 != i._7_1_) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (&_cur_length->types,(value_type_conflict3 *)((long)&i + 7));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&_cur_length->lengths,(value_type_conflict *)&i);
      pbVar2 = std::max<unsigned_char>((uchar *)((long)&i + 6),&local_29);
      i._6_1_ = *pbVar2;
      i._7_1_ = local_29;
      i._0_4_ = 0;
    }
    i._0_4_ = (int)i + 1;
    uStack_28 = uStack_28 + 1;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (&_cur_length->types,(value_type_conflict3 *)((long)&i + 7));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&_cur_length->lengths,(value_type_conflict *)&i);
  _cur_length->num_types = (ulong)i._6_1_ + 1;
  return;
}

Assistant:

void BuildBlockSplit(const std::vector<uint8_t>& block_ids, BlockSplit* split) {
  uint8_t cur_id = block_ids[0];
  uint8_t max_type = cur_id;
  uint32_t cur_length = 1;
  for (size_t i = 1; i < block_ids.size(); ++i) {
    uint8_t next_id = block_ids[i];
    if (next_id != cur_id) {
      split->types.push_back(cur_id);
      split->lengths.push_back(cur_length);
      max_type = std::max(max_type, next_id);
      cur_id = next_id;
      cur_length = 0;
    }
    ++cur_length;
  }
  split->types.push_back(cur_id);
  split->lengths.push_back(cur_length);
  split->num_types = static_cast<size_t>(max_type) + 1;
}